

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

error_code llvm::sys::fs::createUniqueDirectory(Twine *Prefix,SmallVectorImpl<char> *ResultPath)

{
  Child CVar1;
  NodeKind LHSKind;
  NodeKind RHSKind;
  Child RHS;
  error_code eVar2;
  int Dummy;
  Child local_58;
  uint uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  uint local_38;
  undefined4 uStack_34;
  uint uStack_30;
  undefined4 uStack_2c;
  NodeKind local_28;
  char cStack_27;
  undefined6 uStack_26;
  int local_1c;
  
  Twine::Twine((Twine *)&local_38,"-%%%%%%");
  LHSKind = Prefix->LHSKind;
  if ((LHSKind == NullKind) || (local_28 == NullKind)) {
    local_48 = CONCAT62(local_48._2_6_,0x100);
  }
  else if (LHSKind == EmptyKind) {
    local_48 = CONCAT62(uStack_26,CONCAT11(cStack_27,local_28));
    local_58.decUI = local_38;
    local_58._4_4_ = uStack_34;
    uStack_50 = uStack_30;
    uStack_4c = uStack_2c;
  }
  else if (local_28 == EmptyKind) {
    local_48._0_1_ = Prefix->LHSKind;
    local_48._1_1_ = Prefix->RHSKind;
    local_48._2_6_ = *(undefined6 *)&Prefix->field_0x12;
    local_58.decUI = (Prefix->LHS).decUI;
    local_58._4_4_ = *(undefined4 *)((long)&Prefix->LHS + 4);
    uStack_50 = (Prefix->RHS).decUI;
    uStack_4c = *(undefined4 *)((long)&Prefix->RHS + 4);
  }
  else {
    if (Prefix->RHSKind == EmptyKind) {
      Prefix = *(Twine **)&Prefix->LHS;
    }
    else {
      LHSKind = TwineKind;
    }
    RHSKind = TwineKind;
    if (cStack_27 == '\x01') {
      RHSKind = local_28;
    }
    CVar1._4_4_ = uStack_34;
    CVar1.decUI = local_38;
    RHS.twine = (Twine *)&local_38;
    if (cStack_27 == '\x01') {
      RHS = CVar1;
    }
    Twine::Twine((Twine *)&local_58,(Child)Prefix,LHSKind,RHS,RHSKind);
  }
  eVar2 = createUniqueEntity((Twine *)&local_58,&local_1c,ResultPath,true,0,FS_Dir,F_None);
  return eVar2;
}

Assistant:

std::error_code createUniqueDirectory(const Twine &Prefix,
                                      SmallVectorImpl<char> &ResultPath) {
  int Dummy;
  return createUniqueEntity(Prefix + "-%%%%%%", Dummy, ResultPath, true, 0,
                            FS_Dir);
}